

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedStringScanState::ScanToDictionaryVector
          (CompressedStringScanState *this,ColumnSegment *segment,Vector *result,idx_t result_offset
          ,idx_t start,idx_t scan_count)

{
  buffer_ptr<SelectionVector> *this_00;
  idx_t dictionary_size;
  unsigned_long uVar1;
  SelectionVector *pSVar2;
  type dict;
  type sel;
  idx_t decompress_count;
  shared_ptr<duckdb::SelectionVector,_true> local_60;
  string local_50;
  
  uVar1 = BitpackingPrimitives::RoundUpToAlgorithmGroupSize<unsigned_long>(scan_count);
  this_00 = &this->sel_vec;
  if (((this->sel_vec).internal.
       super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || (this->sel_vec_size < uVar1)) {
    this->sel_vec_size = uVar1;
    make_shared_ptr<duckdb::SelectionVector,unsigned_long&>((unsigned_long *)&local_60);
    shared_ptr<duckdb::SelectionVector,_true>::operator=(this_00,&local_60);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.internal.
                super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  pSVar2 = shared_ptr<duckdb::SelectionVector,_true>::operator->(this_00);
  BitpackingPrimitives::UnPackBuffer<unsigned_int>
            ((data_ptr_t)pSVar2->sel_vector,this->base_data + (start * this->current_width >> 3),
             scan_count,this->current_width,false);
  dict = shared_ptr<duckdb::Vector,_true>::operator*(&this->dictionary);
  dictionary_size = this->dictionary_size;
  sel = shared_ptr<duckdb::SelectionVector,_true>::operator*(this_00);
  Vector::Dictionary(result,dict,dictionary_size,sel,scan_count);
  ::std::__cxx11::to_string(&local_50,(unsigned_long)segment);
  DictionaryVector::SetDictionaryId(result,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CompressedStringScanState::ScanToDictionaryVector(ColumnSegment &segment, Vector &result, idx_t result_offset,
                                                       idx_t start, idx_t scan_count) {
	D_ASSERT(start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
	D_ASSERT(scan_count == STANDARD_VECTOR_SIZE);
	D_ASSERT(result_offset == 0);

	idx_t decompress_count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize(scan_count);

	// Create a selection vector of sufficient size if we don't already have one.
	if (!sel_vec || sel_vec_size < decompress_count) {
		sel_vec_size = decompress_count;
		sel_vec = make_buffer<SelectionVector>(decompress_count);
	}

	// Scanning 2048 values, emitting a dict vector
	data_ptr_t dst = data_ptr_cast(sel_vec->data());
	data_ptr_t src = data_ptr_cast(&base_data[(start * current_width) / 8]);

	BitpackingPrimitives::UnPackBuffer<sel_t>(dst, src, scan_count, current_width);

	result.Dictionary(*(dictionary), dictionary_size, *sel_vec, scan_count);
	DictionaryVector::SetDictionaryId(result, to_string(CastPointerToValue(&segment)));
}